

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O1

int GetAllObstaclesDist5
              (uchar *scanline,uchar threshold,int diffstep,double minDist,double maxDist,int NBins,
              int RangeScale,uchar ADLow,uchar ADSpan,int adc8on,
              vector<interval,_std::allocator<interval>_> *distances)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  long lVar5;
  uint uVar6;
  int iVar7;
  double *a;
  ulong uVar8;
  byte bVar9;
  undefined7 in_register_00000089;
  ulong uVar10;
  double dVar11;
  double local_80;
  double local_78;
  double local_70;
  uint local_68;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  interval local_48;
  
  local_68 = (uint)CONCAT71(in_register_00000089,ADLow);
  local_60 = (double)NBins;
  local_78 = (double)RangeScale;
  uVar3 = (uint)(minDist * (local_60 / local_78));
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = uVar3;
  }
  iVar7 = (int)((local_60 / local_78) * maxDist);
  if (NBins + -1 < iVar7) {
    iVar7 = NBins + -1;
  }
  local_80 = -1.0;
  local_70 = -1.0;
  local_64 = diffstep;
  local_50 = maxDist;
  __ptr = malloc((long)NBins);
  if (__ptr == (void *)0x0) {
    iVar7 = 1;
  }
  else {
    uVar10 = (ulong)uVar6;
    if ((int)uVar6 <= iVar7) {
      uVar8 = uVar10;
      do {
        bVar1 = scanline[uVar8];
        bVar9 = bVar1;
        if (adc8on != 0) {
          if ((byte)local_68 < bVar1) {
            bVar9 = 0xff;
            if ((uint)bVar1 < (uint)ADSpan + (local_68 & 0xff)) {
              bVar9 = (byte)(int)(((double)(int)((uint)bVar1 - (local_68 & 0xff)) * 255.0) /
                                 (double)ADSpan);
            }
          }
          else {
            bVar9 = 0;
          }
        }
        *(char *)((long)__ptr + uVar8) = (bVar9 < threshold) + -1;
        uVar8 = uVar8 + 1;
      } while (iVar7 + 1 != uVar8);
    }
    iVar7 = iVar7 - local_64;
    if ((int)uVar6 <= iVar7) {
      dVar11 = local_78 / local_60;
      lVar5 = (long)local_64;
      local_78 = dVar11;
      do {
        iVar4 = (uint)*(byte *)((long)__ptr + uVar10 + lVar5) -
                (uint)*(byte *)((long)__ptr + uVar10);
        iVar2 = -iVar4;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        if ((char)iVar2 == -1) {
          if (local_80 < 0.0) {
            local_80 = (double)(int)uVar10 * dVar11;
          }
        }
        else if (0.0 <= local_80) {
          local_70 = (double)((int)uVar10 + -1) * dVar11;
          interval::interval(&local_48,&local_80,&local_70);
          std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                    (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
          local_80 = -1.0;
          local_70 = -1.0;
          dVar11 = local_78;
        }
        uVar10 = uVar10 + 1;
      } while (iVar7 + 1 != uVar10);
    }
    if (0.0 <= local_80) {
      a = &local_80;
    }
    else {
      a = &local_50;
    }
    local_58 = INFINITY;
    interval::interval(&local_48,a,&local_58);
    std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
              (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
    free(__ptr);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

inline int GetAllObstaclesDist5(unsigned char* scanline, unsigned char threshold, int diffstep, double minDist, double maxDist, 
								int NBins, int RangeScale, unsigned char ADLow, unsigned char ADSpan, int adc8on, vector<interval>& distances)
{
	double r0 = (double)NBins/(double)RangeScale;
	double r1 = (double)RangeScale/(double)NBins;
	int minBin = max(0, (int)(minDist*r0));
	int maxBin = min(NBins-1, (int)(maxDist*r0));
	int i = 0;
	double d0 = -1, d1 = -1;
	unsigned char* scanlinethreshhold = NULL;

	scanlinethreshhold = (unsigned char*)malloc(NBins*sizeof(unsigned char));
	if (scanlinethreshhold == NULL)
	{
		return EXIT_FAILURE;
	}

	i = minBin;
	while (i <= maxBin)
	{
		if (DynamicRangeControl(scanline[i], ADLow, ADSpan, adc8on) >= threshold)
		{
			scanlinethreshhold[i] = 255;
		}
		else
		{
			scanlinethreshhold[i] = 0;
		}
		i++;
	}

	i = minBin;
	while (i <= maxBin-diffstep)
	{
		if (abs((int)(scanlinethreshhold[i+diffstep]-scanlinethreshhold[i])) >= 255)
		{
			if (d0 < 0) 
			{
				d0 = (double)i*r1; // Convert in m.
			}
		}
		else
		{
			if (d0 >= 0) 
			{
				d1 = (double)(i-1)*r1; // Convert in m.
				distances.push_back(interval(d0, d1));
				d0 = -1;
				d1 = -1;
			}
		}
		i++;
	}

	if (d0 >= 0) 
	{
		distances.push_back(interval(d0, oo));
	}
	else
	{
		distances.push_back(interval(maxDist, oo));
	}

	free(scanlinethreshhold);

	return EXIT_SUCCESS;
}